

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
CLPIStreamInfo::composeStreamCodingInfo(CLPIStreamInfo *this,BitStreamWriter *writer)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  StreamType stream_coding_type;
  uint *puVar4;
  uint *puVar5;
  uint *puVar6;
  uint *puVar7;
  bool bVar8;
  uint uVar9;
  uint value;
  uint uVar10;
  int local_48;
  
  puVar4 = (writer->super_BitStream).m_buffer;
  puVar5 = (writer->super_BitStream).m_initBuffer;
  uVar2 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,0);
  puVar6 = (writer->super_BitStream).m_buffer;
  puVar7 = (writer->super_BitStream).m_initBuffer;
  uVar3 = writer->m_bitWrited;
  BitStreamWriter::putBits(writer,8,(this->super_M2TSStreamInfo).stream_coding_type);
  stream_coding_type = (this->super_M2TSStreamInfo).stream_coding_type;
  bVar8 = isVideoStreamType(stream_coding_type);
  if (bVar8) {
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).video_format);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).frame_rate_index);
    BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).aspect_ratio_index);
    BitStreamWriter::putBits(writer,2,0);
    BitStreamWriter::putBit(writer,0);
    BitStreamWriter::putBit(writer,0);
    uVar10 = (this->super_M2TSStreamInfo).HDR;
    uVar9 = 0x22;
    if (uVar10 != 4) {
      uVar9 = 0;
    }
    value = 0x12;
    if ((uVar10 & 0x12) == 0) {
      value = uVar9;
    }
    BitStreamWriter::putBits(writer,8,value);
    uVar10 = (uint)((this->super_M2TSStreamInfo).HDR == 0x10) << 7;
LAB_001e3ef3:
    BitStreamWriter::putBits(writer,8,uVar10);
  }
  else {
    bVar8 = isAudioStreamType(stream_coding_type);
    if (bVar8) {
      uVar10 = 4;
      BitStreamWriter::putBits(writer,4,(uint)(this->super_M2TSStreamInfo).audio_presentation_type);
      bVar1 = (this->super_M2TSStreamInfo).sampling_frequency_index;
    }
    else {
      if (stream_coding_type - SUB_PGS < 2) {
        writeString((this->super_M2TSStreamInfo).language_code,writer,3);
        uVar10 = 0;
        goto LAB_001e3ef3;
      }
      if (stream_coding_type != SUB_TGS) goto LAB_001e3f55;
      bVar1 = (this->super_M2TSStreamInfo).character_code;
      uVar10 = 8;
    }
    BitStreamWriter::putBits(writer,uVar10,(uint)bVar1);
    writeString((this->super_M2TSStreamInfo).language_code,writer,3);
  }
  composeISRC(writer);
  BitStreamWriter::putBits(writer,0x20,0);
LAB_001e3f55:
  local_48 = (int)puVar7;
  *(char *)((long)puVar5 + (long)((int)(uVar2 + ((int)puVar4 - (int)puVar5) * 8) / 8)) =
       (char)((int)((*(int *)&(writer->super_BitStream).m_buffer -
                    *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited) / 8)
       + (char)((int)(uVar3 + ((int)puVar6 - local_48) * 8) / -8);
  return;
}

Assistant:

void CLPIStreamInfo::composeStreamCodingInfo(BitStreamWriter& writer) const
{
    uint8_t* lengthPos = writer.getBuffer() + writer.getBitsCount() / 8;
    writer.putBits(8, 0);  // length
    const unsigned beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, static_cast<int>(stream_coding_type));

    if (isVideoStreamType(stream_coding_type))
    {
        writer.putBits(4, video_format);
        writer.putBits(4, frame_rate_index);
        writer.putBits(4, aspect_ratio_index);
        writer.putBits(2, 0);  // reserved_for_future_use
        writer.putBit(0);      // cc_flag
        writer.putBit(0);      // reserved
        if (HDR & 18)
            writer.putBits(8, 0x12);  // HDR10 or HDR10plus
        else if (HDR == 4)
            writer.putBits(8, 0x22);  // DV
        else
            writer.putBits(8, 0);
        if (HDR == 16)
            writer.putBits(8, 0x80);  // HDR10plus
        else
            writer.putBits(8, 0);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (isAudioStreamType(stream_coding_type))
    {
        writer.putBits(4, audio_presentation_type);
        writer.putBits(4, sampling_frequency_index);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_PGS || stream_coding_type == StreamType::SUB_IGS)
    {
        writeString(language_code, writer, 3);
        writer.putBits(8, 0);  // reserved_for_future_use
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    else if (stream_coding_type == StreamType::SUB_TGS)
    {
        // Text subtitle stream
        writer.putBits(8, character_code);
        writeString(language_code, writer, 3);
        composeISRC(writer);
        writer.putBits(32, 0);  // reserved_for_future_use
    }
    *lengthPos = static_cast<uint8_t>(writer.getBitsCount() / 8 - beforeCount);
}